

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

__m128i sum_squares_i16_4x4_sse2(int16_t *src,int stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  longlong in_RSI;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i alVar6;
  __m128i a;
  __m128i a_00;
  __m128i v_sq_23_d;
  __m128i v_sq_01_d;
  __m128i v_val_23_w;
  __m128i v_val_01_w;
  __m128i v_val_2_w;
  __m128i v_val_0_w;
  
  iVar5 = (int)in_RSI;
  xx_loadl_64(in_RDI);
  alVar6 = xx_loadl_64((void *)((long)in_RDI + (long)(iVar5 << 1) * 2));
  a[0] = (void *)((long)in_RDI + (long)iVar5 * 2);
  a[1] = in_RSI;
  alVar6 = xx_loadh_64(a,alVar6[1]);
  a_00[0] = (void *)((long)in_RDI + (long)(iVar5 * 3) * 2);
  a_00[1] = in_RSI;
  alVar6 = xx_loadh_64(a_00,alVar6[1]);
  auVar4._8_8_ = extraout_XMM0_Qb;
  auVar4._0_8_ = extraout_XMM0_Qa;
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_8_ = extraout_XMM0_Qa;
  pmaddwd(auVar4,auVar3);
  auVar2._8_8_ = extraout_XMM0_Qb_00;
  auVar2._0_8_ = extraout_XMM0_Qa_00;
  auVar1._8_8_ = extraout_XMM0_Qb_00;
  auVar1._0_8_ = extraout_XMM0_Qa_00;
  pmaddwd(auVar2,auVar1);
  alVar6[0] = alVar6[0];
  alVar6[1] = alVar6[1];
  return alVar6;
}

Assistant:

static inline __m128i sum_squares_i16_4x4_sse2(const int16_t *src, int stride) {
  const __m128i v_val_0_w = xx_loadl_64(src + 0 * stride);
  const __m128i v_val_2_w = xx_loadl_64(src + 2 * stride);
  const __m128i v_val_01_w = xx_loadh_64(v_val_0_w, src + 1 * stride);
  const __m128i v_val_23_w = xx_loadh_64(v_val_2_w, src + 3 * stride);
  const __m128i v_sq_01_d = _mm_madd_epi16(v_val_01_w, v_val_01_w);
  const __m128i v_sq_23_d = _mm_madd_epi16(v_val_23_w, v_val_23_w);

  return _mm_add_epi32(v_sq_01_d, v_sq_23_d);
}